

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

void __thiscall CCNR::ls_solver::unsat_a_clause(ls_solver *this,int the_clause)

{
  int iVar1;
  pointer pcVar2;
  pointer plVar3;
  size_t sVar4;
  pointer pvVar5;
  pointer plVar6;
  int local_30;
  int local_2c;
  
  (this->_index_in_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[the_clause] =
       (int)((ulong)((long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_2c = the_clause;
  std::vector<int,_std::allocator<int>_>::push_back(&this->_unsat_clauses,&local_2c);
  pcVar2 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar3 = *(pointer *)
            ((long)&pcVar2[local_2c].literals.
                    super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
  for (plVar6 = *(pointer *)
                 &pcVar2[local_2c].literals.
                  super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl;
      plVar6 != plVar3; plVar6 = plVar6 + 1) {
    sVar4 = plVar6->var_num;
    pvVar5 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = pvVar5[sVar4].unsat_appear;
    pvVar5[sVar4].unsat_appear = iVar1 + 1;
    if (iVar1 == 0) {
      (this->_index_in_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] =
           (int)((ulong)((long)(this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
      local_30 = (int)sVar4;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->_unsat_vars,&local_30);
    }
  }
  return;
}

Assistant:

void ls_solver::unsat_a_clause(int the_clause)
{
    _index_in_unsat_clauses[the_clause] = _unsat_clauses.size();
    _unsat_clauses.push_back(the_clause);
    // update unsat_appear and unsat_vars
    for (lit l : _clauses[the_clause].literals) {
        _vars[l.var_num].unsat_appear++;
        if (1 == _vars[l.var_num].unsat_appear) {
            _index_in_unsat_vars[l.var_num] = _unsat_vars.size();
            _unsat_vars.push_back(l.var_num);
        }
    }
}